

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_states.hpp
# Opt level: O3

void __thiscall duckdb::MultiFileLocalState::~MultiFileLocalState(MultiFileLocalState *this)

{
  pointer ppEVar1;
  _Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_LocalTableFunctionState)._vptr_LocalTableFunctionState =
       (_func_int **)&PTR__MultiFileLocalState_01989778;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&(this->executor).states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  ppEVar1 = (this->executor).expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  DataChunk::~DataChunk(&this->scan_chunk);
  _Var2._M_head_impl =
       (this->local_state).
       super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (LocalTableFunctionState *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_LocalTableFunctionState[1])();
  }
  (this->local_state).
  super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl =
       (LocalTableFunctionState *)0x0;
  this_00 = (this->reader).internal.
            super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  LocalTableFunctionState::~LocalTableFunctionState(&this->super_LocalTableFunctionState);
  operator_delete(this);
  return;
}

Assistant:

explicit MultiFileLocalState(ClientContext &context) : executor(context) {
	}